

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peeker.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::xpression_peeker<char>::
accept<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::basic_chset<char>>>,mpl_::bool_<true>>
          (xpression_peeker<char> *this,
          simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::basic_chset<char>_>_>,_mpl_::bool_<true>_>
          *xpr)

{
  _WordT *p_Var1;
  int iVar2;
  hash_peek_bitset<char> *phVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  ushort uVar8;
  byte bVar19;
  char cVar20;
  byte bVar21;
  char cVar22;
  byte bVar23;
  char cVar24;
  byte bVar25;
  char cVar26;
  byte bVar27;
  undefined1 auVar17 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 uVar9;
  undefined6 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  
  if (xpr->width_ == 1) {
    iVar2 = this->leading_simple_repeat_;
    this->leading_simple_repeat_ = iVar2 + 1;
    xpr->leading_ = -1 < iVar2;
  }
  if (xpr->min_ == 0) {
    phVar3 = this->bset_;
    phVar3->icase_ = false;
    *(undefined4 *)(phVar3->bset_).super__Base_bitset<4UL>._M_w = 0xffffffff;
    *(undefined4 *)((long)(phVar3->bset_).super__Base_bitset<4UL>._M_w + 4) = 0xffffffff;
    *(undefined4 *)((phVar3->bset_).super__Base_bitset<4UL>._M_w + 1) = 0xffffffff;
    *(undefined4 *)((long)(phVar3->bset_).super__Base_bitset<4UL>._M_w + 0xc) = 0xffffffff;
    *(undefined4 *)((phVar3->bset_).super__Base_bitset<4UL>._M_w + 2) = 0xffffffff;
    *(undefined4 *)((long)(phVar3->bset_).super__Base_bitset<4UL>._M_w + 0x14) = 0xffffffff;
    *(undefined4 *)((phVar3->bset_).super__Base_bitset<4UL>._M_w + 3) = 0xffffffff;
    *(undefined4 *)((long)(phVar3->bset_).super__Base_bitset<4UL>._M_w + 0x1c) = 0xffffffff;
    return;
  }
  phVar3 = this->bset_;
  lVar4 = 1;
  lVar5 = 0;
  lVar6 = 0;
  do {
    auVar17 = *(undefined1 (*) [16])((phVar3->bset_).super__Base_bitset<4UL>._M_w + lVar4 + -1);
    auVar28._0_2_ = auVar17._0_2_ >> 1;
    auVar28._2_2_ = auVar17._2_2_ >> 1;
    auVar28._4_2_ = auVar17._4_2_ >> 1;
    auVar28._6_2_ = auVar17._6_2_ >> 1;
    auVar28._8_2_ = auVar17._8_2_ >> 1;
    auVar28._10_2_ = auVar17._10_2_ >> 1;
    auVar28._12_2_ = auVar17._12_2_ >> 1;
    auVar28._14_2_ = auVar17._14_2_ >> 1;
    auVar28 = auVar28 & _DAT_001690e0;
    uVar8 = CONCAT11(auVar17[1] - auVar28[1],auVar17[0] - auVar28[0]);
    uVar9 = CONCAT13(auVar17[3] - auVar28[3],CONCAT12(auVar17[2] - auVar28[2],uVar8));
    uVar10 = CONCAT15(auVar17[5] - auVar28[5],CONCAT14(auVar17[4] - auVar28[4],uVar9));
    uVar11 = CONCAT17(auVar17[7] - auVar28[7],CONCAT16(auVar17[6] - auVar28[6],uVar10));
    auVar12._0_10_ = CONCAT19(auVar17[9] - auVar28[9],CONCAT18(auVar17[8] - auVar28[8],uVar11));
    auVar12[10] = auVar17[10] - auVar28[10];
    auVar12[0xb] = auVar17[0xb] - auVar28[0xb];
    auVar14[0xc] = auVar17[0xc] - auVar28[0xc];
    auVar14._0_12_ = auVar12;
    auVar14[0xd] = auVar17[0xd] - auVar28[0xd];
    auVar16[0xe] = auVar17[0xe] - auVar28[0xe];
    auVar16._0_14_ = auVar14;
    auVar16[0xf] = auVar17[0xf] - auVar28[0xf];
    auVar28 = auVar16 & _DAT_001690f0;
    auVar17._0_2_ = uVar8 >> 2;
    auVar17._2_2_ = (ushort)((uint)uVar9 >> 0x12);
    auVar17._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
    auVar17._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
    auVar17._8_2_ = (ushort)((unkuint10)auVar12._0_10_ >> 0x42);
    auVar17._10_2_ = auVar12._10_2_ >> 2;
    auVar17._12_2_ = auVar14._12_2_ >> 2;
    auVar17._14_2_ = auVar16._14_2_ >> 2;
    auVar17 = auVar17 & _DAT_001690f0;
    cVar7 = auVar17[0] + auVar28[0];
    bVar19 = auVar17[1] + auVar28[1];
    uVar8 = CONCAT11(bVar19,cVar7);
    cVar20 = auVar17[2] + auVar28[2];
    bVar21 = auVar17[3] + auVar28[3];
    uVar9 = CONCAT13(bVar21,CONCAT12(cVar20,uVar8));
    cVar22 = auVar17[4] + auVar28[4];
    bVar23 = auVar17[5] + auVar28[5];
    uVar10 = CONCAT15(bVar23,CONCAT14(cVar22,uVar9));
    cVar24 = auVar17[6] + auVar28[6];
    bVar25 = auVar17[7] + auVar28[7];
    uVar11 = CONCAT17(bVar25,CONCAT16(cVar24,uVar10));
    cVar26 = auVar17[8] + auVar28[8];
    bVar27 = auVar17[9] + auVar28[9];
    auVar13._0_10_ = CONCAT19(bVar27,CONCAT18(cVar26,uVar11));
    auVar13[10] = auVar17[10] + auVar28[10];
    auVar13[0xb] = auVar17[0xb] + auVar28[0xb];
    auVar15[0xc] = auVar17[0xc] + auVar28[0xc];
    auVar15._0_12_ = auVar13;
    auVar15[0xd] = auVar17[0xd] + auVar28[0xd];
    auVar18[0xe] = auVar17[0xe] + auVar28[0xe];
    auVar18._0_14_ = auVar15;
    auVar18[0xf] = auVar17[0xf] + auVar28[0xf];
    auVar29[0] = (char)(uVar8 >> 4) + cVar7;
    auVar29[1] = (bVar19 >> 4) + bVar19;
    auVar29[2] = (char)(ushort)((uint)uVar9 >> 0x14) + cVar20;
    auVar29[3] = (bVar21 >> 4) + bVar21;
    auVar29[4] = (char)(ushort)((uint6)uVar10 >> 0x24) + cVar22;
    auVar29[5] = (bVar23 >> 4) + bVar23;
    auVar29[6] = (char)(ushort)((ulong)uVar11 >> 0x34) + cVar24;
    auVar29[7] = (bVar25 >> 4) + bVar25;
    auVar29[8] = (char)(ushort)((unkuint10)auVar13._0_10_ >> 0x44) + cVar26;
    auVar29[9] = (bVar27 >> 4) + bVar27;
    auVar29[10] = (char)(auVar13._10_2_ >> 4) + auVar13[10];
    auVar29[0xb] = (auVar13[0xb] >> 4) + auVar13[0xb];
    auVar29[0xc] = (char)(auVar15._12_2_ >> 4) + auVar15[0xc];
    auVar29[0xd] = (auVar15[0xd] >> 4) + auVar15[0xd];
    auVar29[0xe] = (char)(auVar18._14_2_ >> 4) + auVar18[0xe];
    auVar29[0xf] = (auVar18[0xf] >> 4) + auVar18[0xf];
    auVar17 = psadbw(auVar29 & _DAT_00169100,(undefined1  [16])0x0);
    lVar5 = lVar5 + auVar17._0_8_;
    lVar6 = lVar6 + auVar17._8_8_;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 5);
  if (lVar6 + lVar5 != 0) {
    if (lVar6 + lVar5 == 0x100) {
      return;
    }
    if (phVar3->icase_ == false) {
      *(undefined4 *)((phVar3->bset_).super__Base_bitset<4UL>._M_w + 2) = 0xffffffff;
      *(undefined4 *)((long)(phVar3->bset_).super__Base_bitset<4UL>._M_w + 0x14) = 0xffffffff;
      *(undefined4 *)((phVar3->bset_).super__Base_bitset<4UL>._M_w + 3) = 0xffffffff;
      *(undefined4 *)((long)(phVar3->bset_).super__Base_bitset<4UL>._M_w + 0x1c) = 0xffffffff;
      *(undefined4 *)(phVar3->bset_).super__Base_bitset<4UL>._M_w = 0xffffffff;
      *(undefined4 *)((long)(phVar3->bset_).super__Base_bitset<4UL>._M_w + 4) = 0xffffffff;
      *(undefined4 *)((phVar3->bset_).super__Base_bitset<4UL>._M_w + 1) = 0xffffffff;
      *(undefined4 *)((long)(phVar3->bset_).super__Base_bitset<4UL>._M_w + 0xc) = 0xffffffff;
      return;
    }
  }
  phVar3->icase_ = true;
  lVar4 = 0;
  do {
    p_Var1 = (phVar3->bset_).super__Base_bitset<4UL>._M_w + lVar4;
    *p_Var1 = *p_Var1 | *(ulong *)((long)(xpr->xpr_).
                                         super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::basic_chset<char>_>
                                         .charset_.super_basic_chset_8bit<char>.bset_.
                                         super__Base_bitset<4UL>._M_w + lVar4 * 8);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return;
}

Assistant:

mpl::false_ accept(simple_repeat_matcher<Xpr, Greedy> const &xpr)
    {
        if(Greedy() && 1U == xpr.width_)
        {
            ++this->leading_simple_repeat_;
            xpr.leading_ = this->leading_simple_repeat();
        }
        0 != xpr.min_ ? xpr.xpr_.peek(*this) : this->fail(); // could be a union of xpr and next
        return mpl::false_();
    }